

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O3

void Llb_Nonlin4Print(Llb_Mgr_t_conflict *p)

{
  Llb_Var_t *pLVar1;
  Llb_Prt_t *pLVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  ulong uVar6;
  
  putchar(10);
  iVar3 = p->nVars;
  if (0 < iVar3) {
    uVar6 = 0;
    do {
      pLVar1 = p->pVars[uVar6];
      if (pLVar1 != (Llb_Var_t *)0x0) {
        printf("Var %3d : ",uVar6 & 0xffffffff);
        pVVar4 = pLVar1->vParts;
        if (0 < pVVar4->nSize) {
          lVar5 = 0;
          do {
            printf("%d ",(ulong)(uint)p->pParts[pVVar4->pArray[lVar5]]->iPart);
            lVar5 = lVar5 + 1;
            pVVar4 = pLVar1->vParts;
          } while (lVar5 < pVVar4->nSize);
        }
        putchar(10);
        iVar3 = p->nVars;
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)iVar3);
  }
  iVar3 = p->iPartFree;
  if (0 < iVar3) {
    uVar6 = 0;
    do {
      pLVar2 = p->pParts[uVar6];
      if (pLVar2 != (Llb_Prt_t *)0x0) {
        printf("Part %3d : ",uVar6 & 0xffffffff);
        pVVar4 = pLVar2->vVars;
        if (0 < pVVar4->nSize) {
          lVar5 = 0;
          do {
            printf("%d ",(ulong)(uint)p->pVars[pVVar4->pArray[lVar5]]->iVar);
            lVar5 = lVar5 + 1;
            pVVar4 = pLVar2->vVars;
          } while (lVar5 < pVVar4->nSize);
        }
        putchar(10);
        iVar3 = p->iPartFree;
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)iVar3);
  }
  return;
}

Assistant:

void Llb_Nonlin4Print( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i, k;
    printf( "\n" );
    Llb_MgrForEachVar( p, pVar, i )
    {
        printf( "Var %3d : ", i );
        Llb_VarForEachPart( p, pVar, pPart, k )
            printf( "%d ", pPart->iPart );
        printf( "\n" );
    }
    Llb_MgrForEachPart( p, pPart, i )
    {
        printf( "Part %3d : ", i );
        Llb_PartForEachVar( p, pPart, pVar, k )
            printf( "%d ", pVar->iVar );
        printf( "\n" );
    }
}